

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int dh_derive(ptls_hpke_kem_t *kem,void *secret,ptls_iovec_t pk_s,ptls_iovec_t pk_r,ptls_iovec_t dh)

{
  int iVar1;
  void *secret_local;
  ptls_hpke_kem_t *kem_local;
  ptls_iovec_t pk_r_local;
  ptls_iovec_t pk_s_local;
  
  iVar1 = extract_and_expand(kem,secret,kem->hash->digest_size,pk_s,pk_r,dh);
  return iVar1;
}

Assistant:

static int dh_derive(ptls_hpke_kem_t *kem, void *secret, ptls_iovec_t pk_s, ptls_iovec_t pk_r, ptls_iovec_t dh)
{
    return extract_and_expand(kem, secret, kem->hash->digest_size, pk_s, pk_r, dh);
}